

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Pack.h
# Opt level: O3

axl_va_list * __thiscall
axl::sl::PackStringBase<char>::operator()
          (axl_va_list *__return_storage_ptr__,PackStringBase<char> *this,void *p,size_t *size,
          axl_va_list *va)

{
  uint uVar1;
  char *__s;
  undefined8 uVar2;
  undefined8 *puVar3;
  size_t sVar4;
  
  uVar1 = *(uint *)va;
  if ((ulong)uVar1 < 0x29) {
    puVar3 = (undefined8 *)((ulong)uVar1 + *(long *)&va->field_0x10);
    *(uint *)va = uVar1 + 8;
  }
  else {
    puVar3 = *(undefined8 **)&va->field_0x8;
    *(undefined8 **)&va->field_0x8 = puVar3 + 1;
  }
  __s = (char *)*puVar3;
  if (__s == (char *)0x0) {
    *size = 1;
    if (p != (void *)0x0) {
      *(undefined8 *)p = 0;
    }
  }
  else {
    sVar4 = strlen(__s);
    *size = sVar4 + 1;
    if (p != (void *)0x0) {
      __wrap_memcpy(p,__s,sVar4 + 1);
    }
  }
  __return_storage_ptr__->m_isInitialized = false;
  uVar2 = *(undefined8 *)&va->field_0x8;
  *(undefined8 *)__return_storage_ptr__ = *(undefined8 *)va;
  *(undefined8 *)&__return_storage_ptr__->field_0x8 = uVar2;
  *(undefined8 *)&__return_storage_ptr__->field_0x10 = *(undefined8 *)&va->field_0x10;
  __return_storage_ptr__->m_isInitialized = true;
  return __return_storage_ptr__;
}

Assistant:

axl_va_list
	operator () (
		void* p,
		size_t* size,
		axl_va_list va
	) {
		T* string = va.arg<T*> ();

		size_t length = StringDetailsBase<T>::calcLength(string);
		size_t stringSize = (length + 1) * sizeof(T);

		*size = stringSize;

		if (p) {
			if (string)
				memcpy(p, string, stringSize);
			else
				*(T**)p = NULL;
		}

		return va;
	}